

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O1

void __thiscall
icu_63::CharacterIterator::CharacterIterator
          (CharacterIterator *this,int32_t length,int32_t textBegin,int32_t textEnd,int32_t position
          )

{
  int iVar1;
  int iVar2;
  
  (this->super_ForwardCharacterIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CharacterIterator_0024be38;
  this->textLength = length;
  this->pos = position;
  this->begin = textBegin;
  this->end = textEnd;
  if (length < 0) {
    this->textLength = 0;
  }
  if (textBegin < 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = this->textLength;
    if (textBegin <= iVar1) goto LAB_00198e90;
  }
  this->begin = iVar1;
LAB_00198e90:
  iVar1 = this->begin;
  iVar2 = iVar1;
  if ((textEnd < iVar1) || (iVar2 = this->textLength, iVar2 < textEnd)) {
    this->end = iVar2;
  }
  if ((position < iVar1) || (iVar1 = this->end, iVar1 < position)) {
    this->pos = iVar1;
  }
  return;
}

Assistant:

CharacterIterator::CharacterIterator(int32_t length, int32_t textBegin, int32_t textEnd, int32_t position)
: textLength(length), pos(position), begin(textBegin), end(textEnd) {
    if(textLength < 0) {
        textLength = 0;
    }
    if(begin < 0) {
        begin = 0;
    } else if(begin > textLength) {
        begin = textLength;
    }
    if(end < begin) {
        end = begin;
    } else if(end > textLength) {
        end = textLength;
    }
    if(pos < begin) {
        pos = begin;
    } else if(pos > end) {
        pos = end;
    }
}